

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

void google::protobuf::internal::WriteVarint(uint32_t num,uint64_t val,string *s)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(num << 3);
  cVar2 = (char)s;
  if (0x7f < num << 3) {
    do {
      std::__cxx11::string::push_back(cVar2);
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar3 >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar2);
  if (0x7f < val) {
    do {
      std::__cxx11::string::push_back(cVar2);
      bVar1 = 0x3fff < val;
      val = val >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar2);
  return;
}

Assistant:

void WriteVarint(uint32_t num, uint64_t val, std::string* s) {
  WriteVarint(num << 3, s);
  WriteVarint(val, s);
}